

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.c
# Opt level: O1

int fiobj_task_wrapper(FIOBJ o,void *p_)

{
  int iVar1;
  undefined1 uVar2;
  uint uVar3;
  fiobj_object_vtable_s *pfVar4;
  
  *(long *)((long)p_ + 0x20) = *(long *)((long)p_ + 0x20) + 1;
  iVar1 = (**p_)(o,*(undefined8 *)((long)p_ + 8));
  if (iVar1 == -1) {
    *(undefined1 *)((long)p_ + 0x28) = 1;
  }
  else {
    uVar3 = (uint)o & 6;
    if (uVar3 == 6) {
      return 0;
    }
    if (o == 0) {
      return 0;
    }
    if ((o & 1) != 0) {
      return 0;
    }
    switch(uVar3) {
    case 0:
      uVar2 = *(undefined1 *)(o & 0xfffffffffffffff8);
      break;
    case 2:
      uVar2 = 0x28;
      break;
    case 4:
      uVar2 = 0x2a;
      break;
    case 6:
      uVar2 = (undefined1)o;
    }
    switch(uVar2) {
    case 0x27:
      pfVar4 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case 0x28:
      pfVar4 = &FIOBJECT_VTABLE_STRING;
      break;
    case 0x29:
      pfVar4 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case 0x2a:
      pfVar4 = &FIOBJECT_VTABLE_HASH;
      break;
    case 0x2b:
      pfVar4 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar4 = &FIOBJECT_VTABLE_NUMBER;
    }
    if (pfVar4->each == (_func_size_t_FIOBJ_size_t__func_int_FIOBJ_void_ptr_ptr_void_ptr *)0x0) {
      return 0;
    }
    *(undefined1 *)((long)p_ + 0x29) = 1;
    *(FIOBJ *)((long)p_ + 0x18) = o;
  }
  return -1;
}

Assistant:

static int fiobj_task_wrapper(FIOBJ o, void *p_) {
  struct task_packet_s *p = p_;
  ++p->counter;
  int ret = p->task(o, p->arg);
  if (ret == -1) {
    p->stop = 1;
    return -1;
  }
  if (FIOBJ_IS_ALLOCATED(o) && FIOBJECT2VTBL(o)->each) {
    p->incomplete = 1;
    p->next = o;
    return -1;
  }
  return 0;
}